

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O1

SQFunctionProto * __thiscall SQFuncState::BuildProto(SQFuncState *this)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  SQObjectType SVar5;
  SQObjectType SVar6;
  uint uVar7;
  uint uVar8;
  SQTable *pSVar9;
  SQObjectPtr *pSVar10;
  SQObjectPtr *pSVar11;
  long *plVar12;
  SQOuterVar *pSVar13;
  SQOuterVar *pSVar14;
  SQLocalVarInfo *pSVar15;
  SQLocalVarInfo *pSVar16;
  longlong *plVar17;
  SQInteger *pSVar18;
  undefined8 uVar19;
  SQFunctionProto *pSVar20;
  SQObjectValue SVar21;
  ulong uVar22;
  long lVar23;
  SQObjectPtr refidx;
  SQObjectPtr key;
  SQObjectPtr val;
  
  pSVar20 = SQFunctionProto::Create
                      (this->_ss,(this->_instructions)._size,this->_nliterals,
                       (this->_parameters)._size,(this->_functions)._size,(this->_outervalues)._size
                       ,(this->_lineinfos)._size,(this->_localvarinfos)._size,
                       (this->_defaultparams)._size);
  refidx.super_SQObject._unVal.pTable = (SQTable *)0x0;
  refidx.super_SQObject._type = OT_NULL;
  key.super_SQObject._unVal.pTable = (SQTable *)0x0;
  key.super_SQObject._type = OT_NULL;
  val.super_SQObject._unVal.pTable = (SQTable *)0x0;
  val.super_SQObject._type = OT_NULL;
  pSVar20->_stacksize = this->_stacksize;
  SVar5 = (pSVar20->_sourcename).super_SQObject._type;
  pSVar9 = (pSVar20->_sourcename).super_SQObject._unVal.pTable;
  (pSVar20->_sourcename).super_SQObject._unVal = (this->_sourcename).super_SQObject._unVal;
  SVar6 = (this->_sourcename).super_SQObject._type;
  (pSVar20->_sourcename).super_SQObject._type = SVar6;
  if ((SVar6 >> 0x1b & 1) != 0) {
    pSVar1 = &(((pSVar20->_sourcename).super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar5 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar20->_bgenerator = this->_bgenerator;
  SVar5 = (pSVar20->_name).super_SQObject._type;
  pSVar9 = (pSVar20->_name).super_SQObject._unVal.pTable;
  (pSVar20->_name).super_SQObject._unVal = (this->_name).super_SQObject._unVal;
  SVar6 = (this->_name).super_SQObject._type;
  (pSVar20->_name).super_SQObject._type = SVar6;
  if ((SVar6 >> 0x1b & 1) != 0) {
    pSVar1 = &(((pSVar20->_name).super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar5 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  while( true ) {
    SVar21.nInteger =
         SQTable::Next((this->_literals).super_SQObject._unVal.pTable,false,&refidx,&key,&val);
    if (SVar21.pTable == (SQTable *)0xffffffffffffffff) break;
    pSVar10 = pSVar20->_literals;
    SVar5 = pSVar10[val.super_SQObject._unVal.nInteger].super_SQObject._type;
    pSVar9 = pSVar10[val.super_SQObject._unVal.nInteger].super_SQObject._unVal.pTable;
    pSVar10[val.super_SQObject._unVal.nInteger].super_SQObject._unVal = key.super_SQObject._unVal;
    pSVar10[val.super_SQObject._unVal.nInteger].super_SQObject._type = key.super_SQObject._type;
    if ((key.super_SQObject._type >> 0x1b & 1) != 0) {
      pSVar1 = &((pSVar10[val.super_SQObject._unVal.nInteger].super_SQObject._unVal.pTable)->
                super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar5 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    if ((refidx.super_SQObject._type & 0x8000000) != 0) {
      pSVar1 = &((refidx.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*((refidx.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
          super_SQRefCounted._vptr_SQRefCounted[2])();
      }
    }
    refidx.super_SQObject._type = OT_INTEGER;
    refidx.super_SQObject._unVal.nInteger = SVar21.nInteger;
  }
  if ((this->_functions)._size != 0) {
    lVar23 = 8;
    uVar22 = 0;
    do {
      pSVar10 = (this->_functions)._vals;
      pSVar11 = pSVar20->_functions;
      uVar7 = *(uint *)((long)pSVar11 + lVar23 + -8);
      plVar12 = *(long **)((long)&(pSVar11->super_SQObject)._type + lVar23);
      *(undefined8 *)((long)&(pSVar11->super_SQObject)._type + lVar23) =
           *(undefined8 *)((long)&(pSVar10->super_SQObject)._type + lVar23);
      uVar8 = *(uint *)((long)pSVar10 + lVar23 + -8);
      *(uint *)((long)pSVar11 + lVar23 + -8) = uVar8;
      if ((uVar8 >> 0x1b & 1) != 0) {
        plVar2 = (long *)(*(long *)((long)&(pSVar11->super_SQObject)._type + lVar23) + 8);
        *plVar2 = *plVar2 + 1;
      }
      if ((uVar7 >> 0x1b & 1) != 0) {
        plVar2 = plVar12 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar12 + 0x10))();
        }
      }
      uVar22 = uVar22 + 1;
      lVar23 = lVar23 + 0x10;
    } while (uVar22 < (this->_functions)._size);
  }
  if ((this->_parameters)._size != 0) {
    lVar23 = 8;
    uVar22 = 0;
    do {
      pSVar10 = (this->_parameters)._vals;
      pSVar11 = pSVar20->_parameters;
      uVar7 = *(uint *)((long)pSVar11 + lVar23 + -8);
      plVar12 = *(long **)((long)&(pSVar11->super_SQObject)._type + lVar23);
      *(undefined8 *)((long)&(pSVar11->super_SQObject)._type + lVar23) =
           *(undefined8 *)((long)&(pSVar10->super_SQObject)._type + lVar23);
      uVar8 = *(uint *)((long)pSVar10 + lVar23 + -8);
      *(uint *)((long)pSVar11 + lVar23 + -8) = uVar8;
      if ((uVar8 >> 0x1b & 1) != 0) {
        plVar2 = (long *)(*(long *)((long)&(pSVar11->super_SQObject)._type + lVar23) + 8);
        *plVar2 = *plVar2 + 1;
      }
      if ((uVar7 >> 0x1b & 1) != 0) {
        plVar2 = plVar12 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar12 + 0x10))();
        }
      }
      uVar22 = uVar22 + 1;
      lVar23 = lVar23 + 0x10;
    } while (uVar22 < (this->_parameters)._size);
  }
  if ((this->_outervalues)._size != 0) {
    lVar23 = 0x20;
    uVar22 = 0;
    do {
      pSVar13 = (this->_outervalues)._vals;
      pSVar14 = pSVar20->_outervalues;
      *(undefined4 *)((long)pSVar14 + lVar23 + -0x20) =
           *(undefined4 *)((long)pSVar13 + lVar23 + -0x20);
      uVar7 = *(uint *)((long)pSVar14 + lVar23 + -0x18);
      plVar12 = *(long **)((long)pSVar14 + lVar23 + -0x10);
      *(undefined8 *)((long)pSVar14 + lVar23 + -0x10) =
           *(undefined8 *)((long)pSVar13 + lVar23 + -0x10);
      uVar8 = *(uint *)((long)pSVar13 + lVar23 + -0x18);
      *(uint *)((long)pSVar14 + lVar23 + -0x18) = uVar8;
      if ((uVar8 >> 0x1b & 1) != 0) {
        plVar2 = (long *)(*(long *)((long)pSVar14 + lVar23 + -0x10) + 8);
        *plVar2 = *plVar2 + 1;
      }
      if ((uVar7 >> 0x1b & 1) != 0) {
        plVar2 = plVar12 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar12 + 0x10))();
        }
      }
      uVar7 = *(uint *)((long)pSVar14 + lVar23 + -8);
      plVar12 = *(long **)((long)&pSVar14->_type + lVar23);
      *(undefined8 *)((long)&pSVar14->_type + lVar23) =
           *(undefined8 *)((long)&pSVar13->_type + lVar23);
      uVar8 = *(uint *)((long)pSVar13 + lVar23 + -8);
      *(uint *)((long)pSVar14 + lVar23 + -8) = uVar8;
      if ((uVar8 >> 0x1b & 1) != 0) {
        plVar2 = (long *)(*(long *)((long)&pSVar14->_type + lVar23) + 8);
        *plVar2 = *plVar2 + 1;
      }
      if ((uVar7 >> 0x1b & 1) != 0) {
        plVar2 = plVar12 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar12 + 0x10))();
        }
      }
      uVar22 = uVar22 + 1;
      lVar23 = lVar23 + 0x28;
    } while (uVar22 < (this->_outervalues)._size);
  }
  if ((this->_localvarinfos)._size != 0) {
    lVar23 = 0;
    uVar22 = 0;
    do {
      pSVar15 = (this->_localvarinfos)._vals;
      pSVar16 = pSVar20->_localvarinfos;
      uVar7 = *(uint *)((long)&(pSVar16->_name).super_SQObject._type + lVar23);
      plVar12 = *(long **)((long)&(pSVar16->_name).super_SQObject._unVal + lVar23);
      *(undefined8 *)((long)&(pSVar16->_name).super_SQObject._unVal + lVar23) =
           *(undefined8 *)((long)&(pSVar15->_name).super_SQObject._unVal + lVar23);
      uVar8 = *(uint *)((long)&(pSVar15->_name).super_SQObject._type + lVar23);
      *(uint *)((long)&(pSVar16->_name).super_SQObject._type + lVar23) = uVar8;
      if ((uVar8 >> 0x1b & 1) != 0) {
        plVar2 = (long *)(*(long *)((long)&(pSVar16->_name).super_SQObject._unVal + lVar23) + 8);
        *plVar2 = *plVar2 + 1;
      }
      if ((uVar7 >> 0x1b & 1) != 0) {
        plVar2 = plVar12 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar12 + 0x10))();
        }
      }
      *(undefined8 *)((long)&pSVar16->_pos + lVar23) =
           *(undefined8 *)((long)&pSVar15->_pos + lVar23);
      puVar3 = (undefined8 *)((long)&pSVar15->_start_op + lVar23);
      uVar19 = puVar3[1];
      puVar4 = (undefined8 *)((long)&pSVar16->_start_op + lVar23);
      *puVar4 = *puVar3;
      puVar4[1] = uVar19;
      uVar22 = uVar22 + 1;
      lVar23 = lVar23 + 0x28;
    } while (uVar22 < (this->_localvarinfos)._size);
  }
  if ((this->_lineinfos)._size != 0) {
    lVar23 = 0;
    uVar22 = 0;
    do {
      puVar3 = (undefined8 *)((long)&((this->_lineinfos)._vals)->_line + lVar23);
      uVar19 = puVar3[1];
      puVar4 = (undefined8 *)((long)&pSVar20->_lineinfos->_line + lVar23);
      *puVar4 = *puVar3;
      puVar4[1] = uVar19;
      uVar22 = uVar22 + 1;
      lVar23 = lVar23 + 0x10;
    } while (uVar22 < (this->_lineinfos)._size);
  }
  if ((this->_defaultparams)._size != 0) {
    plVar17 = (this->_defaultparams)._vals;
    pSVar18 = pSVar20->_defaultparams;
    uVar22 = 0;
    do {
      pSVar18[uVar22] = plVar17[uVar22];
      uVar22 = uVar22 + 1;
    } while (uVar22 < (this->_defaultparams)._size);
  }
  memcpy(pSVar20->_instructions,(this->_instructions)._vals,(this->_instructions)._size << 3);
  pSVar20->_varparams = (ulong)this->_varparams;
  SQObjectPtr::~SQObjectPtr(&val);
  SQObjectPtr::~SQObjectPtr(&key);
  SQObjectPtr::~SQObjectPtr(&refidx);
  return pSVar20;
}

Assistant:

SQFunctionProto *SQFuncState::BuildProto()
{

    SQFunctionProto *f=SQFunctionProto::Create(_ss,_instructions.size(),
        _nliterals,_parameters.size(),_functions.size(),_outervalues.size(),
        _lineinfos.size(),_localvarinfos.size(),_defaultparams.size());

    SQObjectPtr refidx,key,val;
    SQInteger idx;

    f->_stacksize = _stacksize;
    f->_sourcename = _sourcename;
    f->_bgenerator = _bgenerator;
    f->_name = _name;

    while((idx=_table(_literals)->Next(false,refidx,key,val))!=-1) {
        f->_literals[_integer(val)]=key;
        refidx=idx;
    }

    for(SQUnsignedInteger nf = 0; nf < _functions.size(); nf++) f->_functions[nf] = _functions[nf];
    for(SQUnsignedInteger np = 0; np < _parameters.size(); np++) f->_parameters[np] = _parameters[np];
    for(SQUnsignedInteger no = 0; no < _outervalues.size(); no++) f->_outervalues[no] = _outervalues[no];
    for(SQUnsignedInteger nl = 0; nl < _localvarinfos.size(); nl++) f->_localvarinfos[nl] = _localvarinfos[nl];
    for(SQUnsignedInteger ni = 0; ni < _lineinfos.size(); ni++) f->_lineinfos[ni] = _lineinfos[ni];
    for(SQUnsignedInteger nd = 0; nd < _defaultparams.size(); nd++) f->_defaultparams[nd] = _defaultparams[nd];

    memcpy(f->_instructions,&_instructions[0],_instructions.size()*sizeof(SQInstruction));

    f->_varparams = _varparams;

    return f;
}